

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O2

pair<helics::route_id,_helics::ActionMessage> * __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
::pop(pair<helics::route_id,_helics::ActionMessage> *__return_storage_ptr__,
     BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
     *this)

{
  bool bVar1;
  _Elt_pointer __p;
  pointer ppVar2;
  bool bVar3;
  unique_lock<std::mutex> pullLock;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> val;
  unique_lock<std::mutex> local_1d0;
  _Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> local_1c0;
  _Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> local_f8;
  
  std::pair<helics::route_id,_helics::ActionMessage>::
  pair<helics::route_id,_helics::ActionMessage,_true>(__return_storage_ptr__);
  try_pop((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)&local_1c0,this);
  bVar3 = false;
  do {
    if (local_1c0._M_engaged != false) {
      std::pair<helics::route_id,_helics::ActionMessage>::operator=
                (__return_storage_ptr__,(type)&local_1c0);
      std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::_M_reset
                (&local_1c0);
      return __return_storage_ptr__;
    }
    std::unique_lock<std::mutex>::unique_lock(&local_1d0,&this->m_pullLock);
    __p = (this->priorityQueue).c.
          super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->priorityQueue).c.
        super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == __p) {
      ppVar2 = (this->pullElements).
               super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
          ._M_impl.super__Vector_impl_data._M_start != ppVar2) {
LAB_0024a9ac:
        std::pair<helics::route_id,_helics::ActionMessage>::operator=
                  (__return_storage_ptr__,ppVar2 + -1);
        std::
        vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
        ::pop_back(&this->pullElements);
        goto LAB_0024a9c4;
      }
      std::condition_variable::wait((unique_lock *)&this->condition);
      __p = (this->priorityQueue).c.
            super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->priorityQueue).c.
          super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur != __p) goto LAB_0024a98e;
      ppVar2 = (this->pullElements).
               super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
          ._M_impl.super__Vector_impl_data._M_start != ppVar2) goto LAB_0024a9ac;
      std::unique_lock<std::mutex>::unlock(&local_1d0);
      try_pop((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)&local_f8,this);
      std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::
      _M_move_assign(&local_1c0,&local_f8);
      std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::_M_reset
                (&local_f8);
      bVar1 = true;
    }
    else {
LAB_0024a98e:
      std::pair<helics::route_id,_helics::ActionMessage>::operator=(__return_storage_ptr__,__p);
      std::
      deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
      ::pop_front(&(this->priorityQueue).c);
LAB_0024a9c4:
      bVar3 = true;
      bVar1 = false;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_1d0);
    if (!bVar1) {
      std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::_M_reset
                (&local_1c0);
      if (!bVar3) {
        helics::ActionMessage::~ActionMessage(&__return_storage_ptr__->second);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

T pop()
        {
            T actval;
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                condition.wait(pullLock);  // now wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                pullLock.unlock();
                val = try_pop();
            }
            // move the value out of the optional
            actval = std::move(*val);
            return actval;
        }